

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DragScalarN(char *label,ImGuiDataType data_type,void *p_data,int components,
                       float v_speed,void *p_min,void *p_max,char *format,ImGuiSliderFlags flags)

{
  size_t sVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  char *text_end;
  bool bVar4;
  int int_id;
  float w_full;
  
  pIVar2 = GImGui;
  GImGui->CurrentWindow->WriteAccessed = true;
  if (pIVar2->CurrentWindow->SkipItems == false) {
    BeginGroup();
    PushID(label);
    w_full = CalcItemWidth();
    PushMultiItemsWidths(components,w_full);
    int_id = 0;
    if (components < 1) {
      bVar4 = false;
    }
    else {
      sVar1 = GDataTypeInfo[data_type].Size;
      bVar4 = false;
      do {
        PushID(int_id);
        if (int_id != 0) {
          SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
        }
        bVar3 = DragScalar("",data_type,p_data,v_speed,p_min,p_max,format,flags);
        bVar4 = (bool)(bVar4 | bVar3);
        PopID();
        PopItemWidth();
        p_data = (void *)((long)p_data + sVar1);
        int_id = int_id + 1;
      } while (components != int_id);
    }
    PopID();
    text_end = FindRenderedTextEnd(label,(char *)0x0);
    if (text_end != label) {
      SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
      TextEx(label,text_end,0);
    }
    EndGroup();
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ImGui::DragScalarN(const char* label, ImGuiDataType data_type, void* p_data, int components, float v_speed, const void* p_min, const void* p_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components, CalcItemWidth());
    size_t type_size = GDataTypeInfo[data_type].Size;
    for (int i = 0; i < components; i++)
    {
        PushID(i);
        if (i > 0)
            SameLine(0, g.Style.ItemInnerSpacing.x);
        value_changed |= DragScalar("", data_type, p_data, v_speed, p_min, p_max, format, flags);
        PopID();
        PopItemWidth();
        p_data = (void*)((char*)p_data + type_size);
    }
    PopID();

    const char* label_end = FindRenderedTextEnd(label);
    if (label != label_end)
    {
        SameLine(0, g.Style.ItemInnerSpacing.x);
        TextEx(label, label_end);
    }

    EndGroup();
    return value_changed;
}